

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesFanGetState(zes_fan_handle_t hFan,zes_fan_speed_units_t units,int32_t *pSpeed)

{
  zes_pfnFanGetState_t pfnGetState;
  ze_result_t result;
  int32_t *pSpeed_local;
  zes_fan_speed_units_t units_local;
  zes_fan_handle_t hFan_local;
  
  pfnGetState._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cda8 != (code *)0x0) {
    pfnGetState._4_4_ = (*DAT_0011cda8)(hFan,units,pSpeed);
  }
  return pfnGetState._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFanGetState(
        zes_fan_handle_t hFan,                          ///< [in] Handle for the component.
        zes_fan_speed_units_t units,                    ///< [in] The units in which the fan speed should be returned.
        int32_t* pSpeed                                 ///< [in,out] Will contain the current speed of the fan in the units
                                                        ///< requested. A value of -1 indicates that the fan speed cannot be
                                                        ///< measured.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetState = context.zesDdiTable.Fan.pfnGetState;
        if( nullptr != pfnGetState )
        {
            result = pfnGetState( hFan, units, pSpeed );
        }
        else
        {
            // generic implementation
        }

        return result;
    }